

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkParseInt_rec(char *pStr,Ifn_Ntk_t *p,char **ppFinal,int *piNode)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  undefined8 unaff_RBX;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  byte bVar9;
  byte *pbVar10;
  int pFanins [11];
  byte *local_80;
  undefined4 local_74;
  char **local_70;
  uint local_68 [14];
  
  bVar1 = *pStr;
  if (bVar1 < 0x5b) {
    if (bVar1 != 0x28) {
      if (bVar1 == 0x3c) {
        lVar6 = 5;
        local_74 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
        goto LAB_003bba5a;
      }
LAB_003bba46:
      local_74 = 0;
      lVar6 = 0;
      goto LAB_003bba5a;
    }
    lVar6 = 3;
  }
  else if (bVar1 == 0x7b) {
    lVar6 = 6;
  }
  else {
    if (bVar1 != 0x5b) goto LAB_003bba46;
    lVar6 = 4;
  }
  local_74 = 0;
LAB_003bba5a:
  local_80 = (byte *)(pStr + 1);
  pbVar2 = (byte *)Ifn_Symbs[lVar6];
  if (bVar1 != *pbVar2) {
    __assert_fail("*pStr == Open",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                  ,0xef,"char *Ifn_NtkParseFindClosingParenthesis(char *, char, char)");
  }
  if (bVar1 != 0) {
    pbVar10 = (byte *)(pStr + 1);
    iVar8 = 0;
    uVar7 = 0;
    bVar9 = bVar1;
    do {
      iVar8 = (iVar8 + (uint)(bVar9 == bVar1)) - (uint)(bVar9 == pbVar2[1]);
      if (iVar8 == 0) {
        *ppFinal = (char *)0x0;
        uVar5 = 0;
        local_70 = ppFinal;
        if (1 < uVar7) {
          uVar5 = 0;
          do {
            if (uVar5 == 0xb) {
              __assert_fail("nFanins < IFN_INS",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                            ,0x106,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
            }
            bVar1 = *local_80;
            if ((byte)(bVar1 + 0x9f) < 0x1a) {
              local_68[uVar5] = (uint)(byte)(bVar1 + 0x9f);
              local_80 = local_80 + 1;
            }
            else {
              uVar4 = bVar1 - 0x3c;
              if (((0x3f < uVar4) || ((0x8000000080000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
                 (bVar1 != 0x28)) {
                Ifn_ErrorMessage("Substring \"%s\" contans unrecognized symbol \'%c\'.\n");
                return 0;
              }
              iVar8 = Ifn_NtkParseInt_rec((char *)local_80,p,(char **)&local_80,piNode);
              if (iVar8 == 0) {
                return 0;
              }
              local_68[uVar5] = *piNode - 1;
            }
            uVar5 = uVar5 + 1;
          } while (local_80 < pbVar10 + -1);
        }
        if (pbVar10 + -1 != local_80) {
          __assert_fail("pStr == pLim",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                        ,0x112,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
        }
        iVar8 = *piNode;
        *piNode = iVar8 + 1;
        uVar4 = *(uint *)(p->Nodes + iVar8);
        uVar3 = uVar4 & 0xfffffff8 | (uint)lVar6;
        *(uint *)(p->Nodes + iVar8) = uVar3;
        if ((uVar4 & 0xf8) == 0) {
          *(uint *)(p->Nodes + iVar8) = uVar3 | (int)uVar5 * 8 & 0xffU;
          memcpy(p->Nodes[iVar8].Fanins,local_68,(uVar5 & 0xffffffff) << 2);
          *local_70 = (char *)pbVar10;
          if (((byte)local_74 & (int)uVar5 != 3) != 1) {
            return 1;
          }
          Ifn_ErrorMessage("MUX should have exactly three fanins.\n");
          return 0;
        }
        __assert_fail("pObj->nFanins == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                      ,0x115,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
      }
      uVar7 = uVar7 + 1;
      bVar9 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    } while (bVar9 != 0);
  }
  *ppFinal = (char *)0x0;
  Ifn_ErrorMessage("For symbol \'%c\' cannot find matching symbol \'%c\'.\n",
                   (ulong)(uint)(int)(char)*pbVar2,(ulong)(uint)(int)(char)pbVar2[1]);
  return 0;
}

Assistant:

int Ifn_NtkParseInt_rec( char * pStr, Ifn_Ntk_t * p, char ** ppFinal, int * piNode )
{
    Ifn_Obj_t * pObj;
    int nFanins = 0, pFanins[IFN_INS];
    int Type = Inf_ManOpenSymb( pStr );
    char * pLim = Ifn_NtkParseFindClosingParenthesis( pStr++, Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    *ppFinal = NULL;
    if ( pLim == NULL )
        return Ifn_ErrorMessage( "For symbol \'%c\' cannot find matching symbol \'%c\'.\n", Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    while ( pStr < pLim )
    {
        assert( nFanins < IFN_INS );
        if ( pStr[0] >= 'a' && pStr[0] <= 'z' )
            pFanins[nFanins++] = pStr[0] - 'a', pStr++; 
        else if ( Inf_ManOpenSymb(pStr) )
        {
            if ( !Ifn_NtkParseInt_rec( pStr, p, &pStr, piNode ) )
                return 0;
            pFanins[nFanins++] = *piNode - 1;
        }
        else
            return Ifn_ErrorMessage( "Substring \"%s\" contans unrecognized symbol \'%c\'.\n", pStr, pStr[0] );
    }
    assert( pStr == pLim );
    pObj = p->Nodes + (*piNode)++;
    pObj->Type = Type;
    assert( pObj->nFanins == 0 );
    pObj->nFanins = nFanins;
    memcpy( pObj->Fanins, pFanins, sizeof(int) * nFanins );
    *ppFinal = pLim + 1;
    if ( Type == IFN_DSD_MUX && nFanins != 3 )
        return Ifn_ErrorMessage( "MUX should have exactly three fanins.\n" );
    return 1;
}